

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

int uv_timer_stop(uv_timer_t *handle)

{
  void **ppvVar1;
  uint *puVar2;
  anon_struct_16_2_d918446b_for_timer_heap *heap;
  uint uVar3;
  uv_loop_t *puVar4;
  heap_node *child;
  heap_node *phVar5;
  long *plVar6;
  bool bVar7;
  heap_node *phVar8;
  int iVar9;
  uint uVar10;
  anon_struct_16_2_d918446b_for_timer_heap *paVar11;
  uint uVar12;
  
  if ((handle->flags & 4) != 0) {
    puVar4 = handle->loop;
    uVar3 = (puVar4->timer_heap).nelts;
    if (uVar3 != 0) {
      heap = &puVar4->timer_heap;
      ppvVar1 = handle->heap_node;
      paVar11 = heap;
      if (uVar3 != 1) {
        iVar9 = 0;
        uVar10 = 0;
        uVar12 = uVar3;
        do {
          uVar10 = (uVar12 & 1) + uVar10 * 2;
          iVar9 = iVar9 + -1;
          bVar7 = 3 < uVar12;
          uVar12 = uVar12 >> 1;
        } while (bVar7);
        do {
          paVar11 = (anon_struct_16_2_d918446b_for_timer_heap *)
                    ((ulong)(uVar10 * 8 & 8) + (long)paVar11->min);
          uVar10 = uVar10 >> 1;
          iVar9 = iVar9 + 1;
        } while (iVar9 != 0);
      }
      (puVar4->timer_heap).nelts = uVar3 - 1;
      child = (heap_node *)paVar11->min;
      paVar11->min = (void *)0x0;
      if (child == (heap_node *)ppvVar1) {
        if ((void **)heap->min == ppvVar1) {
          heap->min = (void *)0x0;
        }
      }
      else {
        phVar5 = (heap_node *)handle->heap_node[0];
        child->left = phVar5;
        phVar8 = (heap_node *)handle->heap_node[1];
        child->right = phVar8;
        child->parent = (heap_node *)handle->heap_node[2];
        if (phVar5 != (heap_node *)0x0) {
          phVar5->parent = child;
          phVar8 = child->right;
        }
        if (phVar8 != (heap_node *)0x0) {
          phVar8->parent = child;
        }
        plVar6 = (long *)handle->heap_node[2];
        paVar11 = heap;
        if (plVar6 != (long *)0x0) {
          paVar11 = (anon_struct_16_2_d918446b_for_timer_heap *)
                    (plVar6 + ((void **)*plVar6 != ppvVar1));
        }
        paVar11->min = child;
        while( true ) {
          phVar5 = child->left;
          phVar8 = child;
          if (phVar5 != (heap_node *)0x0) {
            if ((phVar5[1].left < child[1].left) ||
               ((phVar5[1].left <= child[1].left && (phVar5[1].parent < child[1].parent)))) {
              phVar8 = phVar5;
            }
          }
          phVar5 = child->right;
          if (phVar5 != (heap_node *)0x0) {
            if ((phVar5[1].left < phVar8[1].left) ||
               ((phVar5[1].left <= phVar8[1].left && (phVar5[1].parent < phVar8[1].parent)))) {
              phVar8 = phVar5;
            }
          }
          if (phVar8 == child) break;
          heap_node_swap((heap *)heap,child,phVar8);
        }
        while (phVar5 = child->parent, phVar5 != (heap_node *)0x0) {
          if ((phVar5[1].left <= child[1].left) &&
             ((phVar5[1].left < child[1].left || (phVar5[1].parent <= child[1].parent)))) break;
          heap_node_swap((heap *)heap,phVar5,child);
        }
      }
    }
    uVar3 = handle->flags;
    if (((uVar3 & 4) != 0) && (handle->flags = uVar3 & 0xfffffffb, (uVar3 & 8) != 0)) {
      puVar2 = &handle->loop->active_handles;
      *puVar2 = *puVar2 - 1;
    }
  }
  return 0;
}

Assistant:

int uv_timer_stop(uv_timer_t* handle) {
  if (!uv__is_active(handle))
    return 0;

  heap_remove(timer_heap(handle->loop),
              (struct heap_node*) &handle->heap_node,
              timer_less_than);
  uv__handle_stop(handle);

  return 0;
}